

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

EventTriggerStatementSyntax * __thiscall
slang::parsing::Parser::parseEventTriggerStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  SyntaxNode *this_00;
  NameSyntax *name;
  EventTriggerStatementSyntax *pEVar1;
  Token trigger;
  SourceRange range;
  Token semi;
  SyntaxKind local_9c;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  trigger = ParserBase::consume(&this->super_ParserBase);
  if (trigger.kind == MinusDoubleArrow) {
    this_00 = &parseTimingControl(this,false)->super_SyntaxNode;
    if (this_00 == (SyntaxNode *)0x0) {
      this_00 = (SyntaxNode *)0x0;
    }
    else if (this_00->kind == CycleDelay) {
      range = slang::syntax::SyntaxNode::sourceRange(this_00);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x2b0005,range);
    }
    local_9c = NonblockingEventTriggerStatement;
  }
  else {
    local_9c = BlockingEventTriggerStatement;
    this_00 = (SyntaxNode *)0x0;
  }
  name = parseName(this);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00cb67f8;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pEVar1 = slang::syntax::SyntaxFactory::eventTriggerStatement
                     (&this->factory,local_9c,label,&local_68,trigger,(TimingControlSyntax *)this_00
                      ,name,semi);
  return pEVar1;
}

Assistant:

EventTriggerStatementSyntax& Parser::parseEventTriggerStatement(NamedLabelSyntax* label,
                                                                AttrList attributes) {
    auto trigger = consume();

    SyntaxKind kind = SyntaxKind::BlockingEventTriggerStatement;
    TimingControlSyntax* timing = nullptr;
    if (trigger.kind == TokenKind::MinusDoubleArrow) {
        kind = SyntaxKind::NonblockingEventTriggerStatement;
        timing = parseTimingControl();
        if (timing && timing->kind == SyntaxKind::CycleDelay)
            addDiag(diag::EventTriggerCycleDelay, timing->sourceRange());
    }

    auto& name = parseName();
    return factory.eventTriggerStatement(kind, label, attributes, trigger, timing, name,
                                         expect(TokenKind::Semicolon));
}